

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeOpenTypeWrapper.cpp
# Opt level: O2

EFontStretch __thiscall
FreeTypeOpenTypeWrapper::GetFontStretchForPCLTValue
          (FreeTypeOpenTypeWrapper *this,FT_Char inWidthValue)

{
  EFontStretch EVar1;
  EFontStretch EVar2;
  undefined7 in_register_00000031;
  
  EVar2 = eFontStretchUltraCondensed;
  if (inWidthValue != -5) {
    EVar2 = (int)CONCAT71(in_register_00000031,inWidthValue) + eFontStretchNormal;
  }
  EVar1 = eFontStretchUltraExpanded;
  if (inWidthValue != '\x05') {
    EVar1 = EVar2;
  }
  return EVar1;
}

Assistant:

EFontStretch FreeTypeOpenTypeWrapper::GetFontStretchForPCLTValue(FT_Char inWidthValue)
{
	return 
		(5 == inWidthValue) ? 
			eFontStretchUltraExpanded : 
			(-5 == inWidthValue) ?
			eFontStretchUltraCondensed :
			EFontStretch(eFontStretchNormal + inWidthValue);

	// mapping edges to extremes, the rest is linear
}